

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_severity.cc
# Opt level: O0

ostream * absl::lts_20240722::operator<<(ostream *os,LogSeverityAtLeast s)

{
  ostream *os_00;
  LogSeverityAtLeast s_local;
  ostream *os_local;
  
  if (s < 4) {
    os_00 = std::operator<<(os,">=");
    os_local = operator<<(os_00,s);
  }
  else {
    os_local = os;
    if (s == kInfinity) {
      os_local = std::operator<<(os,"INFINITY");
    }
  }
  return os_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, absl::LogSeverityAtLeast s) {
  switch (s) {
    case absl::LogSeverityAtLeast::kInfo:
    case absl::LogSeverityAtLeast::kWarning:
    case absl::LogSeverityAtLeast::kError:
    case absl::LogSeverityAtLeast::kFatal:
      return os << ">=" << static_cast<absl::LogSeverity>(s);
    case absl::LogSeverityAtLeast::kInfinity:
      return os << "INFINITY";
  }
  return os;
}